

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O1

void __thiscall
ROM::Request::Node::visit
          (Node *this,function<void_(ROM::Request::ListType,_unsigned_long)> *enter_list,
          function<void_()> *exit_list,
          function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>
          *add_item)

{
  Type TVar1;
  pointer pNVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ListType local_ec;
  function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)> *local_e8;
  ListType local_dc;
  _Any_data *local_d8;
  function<void_(ROM::Request::ListType,_unsigned_long)> *local_d0;
  Description local_c8;
  
  TVar1 = this->type;
  local_e8 = add_item;
  if (TVar1 < One) {
    local_c8._0_8_ =
         ((long)(this->children).
                super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->children).
                super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    local_ec = (ListType)(TVar1 != Any);
    local_dc = local_ec;
    local_d8 = (_Any_data *)exit_list;
    if ((enter_list->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003bf73c;
    local_d0 = enter_list;
    (*enter_list->_M_invoker)((_Any_data *)enter_list,&local_ec,(unsigned_long *)&local_c8);
    pNVar2 = (this->children).
             super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    exit_list = (function<void_()> *)local_d8;
    if ((this->children).super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
        ._M_impl.super__Vector_impl_data._M_finish != pNVar2) {
      lVar3 = -1;
      lVar4 = 0;
      uVar5 = 0;
      do {
        if (*(int *)((long)&pNVar2->type + lVar4) == 2) {
          Description::Description(&local_c8,*(Name *)((long)&pNVar2->name + lVar4));
          std::
          function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>::
          operator()(local_e8,local_dc,&local_c8,(&pNVar2->is_optional)[lVar4],
                     ((long)(this->children).
                            super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->children).
                            super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 +
                     lVar3);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_c8.crc32s._M_t);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_c8.file_names);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.descriptive_name._M_dataplus._M_p != &local_c8.descriptive_name.field_2) {
            operator_delete(local_c8.descriptive_name._M_dataplus._M_p,
                            local_c8.descriptive_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.machine_name._M_dataplus._M_p != &local_c8.machine_name.field_2) {
            operator_delete(local_c8.machine_name._M_dataplus._M_p,
                            local_c8.machine_name.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          visit((Node *)((long)&pNVar2->type + lVar4),local_d0,(function<void_()> *)local_d8,
                local_e8);
        }
        uVar5 = uVar5 + 1;
        pNVar2 = (this->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start;
        lVar3 = lVar3 + -1;
        lVar4 = lVar4 + 0x28;
        exit_list = (function<void_()> *)local_d8;
      } while (uVar5 < (ulong)(((long)(this->children).
                                      super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 3
                               ) * -0x3333333333333333));
    }
  }
  else {
    if (TVar1 != One) {
      return;
    }
    local_ec = Single;
    local_c8._0_8_ = 1;
    if ((enter_list->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003bf73c;
    (*enter_list->_M_invoker)((_Any_data *)enter_list,&local_ec,(unsigned_long *)&local_c8);
    Description::Description(&local_c8,this->name);
    std::function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>::
    operator()(local_e8,Any,&local_c8,this->is_optional,0);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_c8.crc32s._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8.file_names);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.descriptive_name._M_dataplus._M_p != &local_c8.descriptive_name.field_2) {
      operator_delete(local_c8.descriptive_name._M_dataplus._M_p,
                      local_c8.descriptive_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.machine_name._M_dataplus._M_p != &local_c8.machine_name.field_2) {
      operator_delete(local_c8.machine_name._M_dataplus._M_p,
                      local_c8.machine_name.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)((long)exit_list + 0x10) != 0) {
    (**(code **)((long)exit_list + 0x18))((_Any_data *)exit_list);
    return;
  }
LAB_003bf73c:
  std::__throw_bad_function_call();
}

Assistant:

void Request::Node::visit(
	const std::function<void(ListType, size_t)> &enter_list,
	const std::function<void(void)> &exit_list,
	const std::function<void(ROM::Request::ListType type, const ROM::Description &, bool is_optional, size_t remaining)> &add_item
) const {
	switch(type) {
		case Type::One:
			enter_list(ListType::Single, 1);
			add_item(ROM::Request::ListType::Any, Description(name), is_optional, 0);
			exit_list();
		break;

		case Type::Any:
		case Type::All: {
			const ListType list_type = type == Type::Any ? ListType::Any : ListType::All;
			enter_list(list_type, children.size());
			for(size_t index = 0; index < children.size(); index++) {
				auto &child = children[index];

				if(child.type == Type::One) {
					add_item(list_type, Description(child.name), child.is_optional, children.size() - 1 - index);
				} else {
					child.visit(enter_list, exit_list, add_item);
				}
			}
			exit_list();
		} break;
	}
}